

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O3

void __thiscall GameTitle::GameTitle(GameTitle *this)

{
  Animation::Animation(&this->super_Animation);
  (this->super_Animation)._vptr_Animation = (_func_int **)&PTR_displayAnimation_00135428;
  (this->firstWord).text._M_dataplus._M_p = (pointer)&(this->firstWord).text.field_2;
  (this->firstWord).text._M_string_length = 0;
  (this->firstWord).text.field_2._M_local_buf[0] = '\0';
  (this->secondWord).text._M_dataplus._M_p = (pointer)&(this->secondWord).text.field_2;
  (this->secondWord).text._M_string_length = 0;
  (this->secondWord).text.field_2._M_local_buf[0] = '\0';
  (this->thirdWord).text._M_dataplus._M_p = (pointer)&(this->thirdWord).text.field_2;
  (this->thirdWord).text._M_string_length = 0;
  (this->thirdWord).text.field_2._M_local_buf[0] = '\0';
  (this->fourthWord).text._M_dataplus._M_p = (pointer)&(this->fourthWord).text.field_2;
  (this->fourthWord).text._M_string_length = 0;
  (this->fourthWord).text.field_2._M_local_buf[0] = '\0';
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Animation).name,0,
             (char *)(this->super_Animation).name._M_string_length,0x127130);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Animation).description,0,
             (char *)(this->super_Animation).description._M_string_length,0x1288d6);
  std::__cxx11::string::_M_replace
            ((ulong)&this->firstWord,0,(char *)(this->firstWord).text._M_string_length,0x12892c);
  std::__cxx11::string::_M_replace
            ((ulong)&this->secondWord,0,(char *)(this->secondWord).text._M_string_length,0x128935);
  std::__cxx11::string::_M_replace
            ((ulong)&this->thirdWord,0,(char *)(this->thirdWord).text._M_string_length,0x12893c);
  std::__cxx11::string::_M_replace
            ((ulong)&this->fourthWord,0,(char *)(this->fourthWord).text._M_string_length,0x12895b);
  std::__cxx11::string::_M_replace
            ((ulong)&this->title,0,(char *)(this->title)._M_string_length,0x128945);
  return;
}

Assistant:

GameTitle::GameTitle() {
    // Set the default values of the base class members
    name = "GameTitle";
    description = "A slide-in text animation of the game title. \nIntended for the beginning of the game.";

    // Initialize the private members
    firstWord.text = "Private ";
    secondWord.text = "Keys, ";
    thirdWord.text = "Members ";
    fourthWord.text = "Only";

    title = "Private Keys, Members Only";
}